

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIP.cpp
# Opt level: O1

void __thiscall Car::Car(Car *this,shared_ptr<Engine> *engine,shared_ptr<ILogger> *logg)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long *local_38 [2];
  long local_28 [2];
  
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  peVar2 = (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"car is created","");
  (*peVar2->_vptr_ILogger[2])(peVar2,local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

explicit Car(std::shared_ptr<Engine> engine, std::shared_ptr<ILogger> logg)
		:	engine(std::move(engine)),
			logger(std::move(logg))
	{
		logger->log("car is created");
	}